

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cpp
# Opt level: O2

int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,mbedtls_mpi *Y,uchar assign)

{
  ushort uVar1;
  short sVar2;
  int iVar3;
  ulong uVar4;
  mbedtls_mpi_uint mVar5;
  ulong uVar6;
  mbedtls_ct_condition_t cond;
  
  iVar3 = mbedtls_mpi_grow(X,(ulong)Y->n);
  if (iVar3 == 0) {
    uVar6 = -((assign ^ mbedtls_ct_zero) >> 1) | -(assign ^ mbedtls_ct_zero);
    cond = (long)uVar6 >> 0x3f;
    sVar2 = mbedtls_ct_mpi_sign_if(cond,Y->s,X->s);
    X->s = sVar2;
    mbedtls_mpi_core_cond_assign(X->p,Y->p,(ulong)Y->n,cond);
    uVar1 = X->n;
    for (uVar4 = (ulong)Y->n; uVar4 < uVar1; uVar4 = uVar4 + 1) {
      if ((long)uVar6 < 0) {
        mVar5 = 0;
      }
      else {
        mVar5 = X->p[uVar4];
      }
      X->p[uVar4] = mVar5;
    }
  }
  return iVar3;
}

Assistant:

__declspec(noinline)
#endif
int mbedtls_mpi_safe_cond_assign(mbedtls_mpi *X,
                                 const mbedtls_mpi *Y,
                                 unsigned char assign)
{
    int ret = 0;

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, Y->n));

    {
        mbedtls_ct_condition_t do_assign = mbedtls_ct_bool(assign);

        X->s = mbedtls_ct_mpi_sign_if(do_assign, Y->s, X->s);

        mbedtls_mpi_core_cond_assign(X->p, Y->p, Y->n, do_assign);

        mbedtls_ct_condition_t do_not_assign = mbedtls_ct_bool_not(do_assign);
        for (size_t i = Y->n; i < X->n; i++) {
            X->p[i] = mbedtls_ct_mpi_uint_if_else_0(do_not_assign, X->p[i]);
        }
    }

cleanup:
    return ret;
}